

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

Var Js::JavascriptMap::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  int n;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  void **ppvVar9;
  JavascriptMethod p_Var10;
  JavascriptLibrary *pJVar11;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *local_170;
  JavascriptMap *local_138;
  CallInfo local_100;
  CallInfo local_f8;
  undefined1 local_f0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var value;
  WriteBarrierPtr<void> local_c8;
  Var key;
  Iterator iterator;
  Var thisArg;
  RecyclableObject *callBackFn;
  JavascriptMap *map;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x9a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)function_local,
             L"Map.prototype.forEach",&stack0x00000000);
  callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar3 = VarIs<Js::JavascriptMap>((Var)callInfo_local);
  if (bVar3) {
    local_138 = UnsafeVarTo<Js::JavascriptMap>((Var)callInfo_local);
  }
  else {
    local_138 = (JavascriptMap *)0x0;
  }
  if (local_138 != (JavascriptMap *)0x0) {
    if (1 < ((uint)scriptContext & 0xffffff)) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      bVar3 = JavascriptConversion::IsCallable(pvVar7);
      if (bVar3) {
        pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
        pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
        if (((uint)scriptContext & 0xffffff) < 3) {
          pJVar11 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
          local_170 = (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                       *)JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
        }
        else {
          local_170 = (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                       *)Arguments::operator[]((Arguments *)&scriptContext,2);
        }
        iterator.current.ptr = local_170;
        GetIterator((JavascriptMap *)&key);
        while (bVar3 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                       ::Iterator::Next((Iterator *)&key), bVar3) {
          MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          ::Iterator::Current((Iterator *)&key);
          JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
                    ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                     &value);
          ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&value);
          local_c8.ptr = *ppvVar9;
          MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          ::Iterator::Current((Iterator *)&key);
          JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
                    ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                     &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
          ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__
                              ((WriteBarrierPtr *)
                               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
          pvVar1 = *ppvVar9;
          pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_f0,pTVar5);
          pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar5);
          pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
          ThreadContext::AssertJsReentrancy(pTVar5);
          p_Var10 = RecyclableObject::GetEntryPoint(pRVar8);
          CheckIsExecutable(pRVar8,p_Var10);
          p_Var10 = RecyclableObject::GetEntryPoint(pRVar8);
          CallInfo::CallInfo(&local_f8,CallFlags_Value,4);
          CallInfo::CallInfo(&local_100,CallFlags_Value,4);
          (*p_Var10)(pRVar8,(CallInfo)pRVar8,local_f8,0,0,0,0,local_100,iterator.current.ptr,pvVar1,
                     local_c8.ptr,local_138);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_f0);
        }
        pJVar11 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
        pRVar8 = JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80)
        ;
        return pRVar8;
      }
    }
    JavascriptError::ThrowTypeError
              ((ScriptContext *)__tag.entry.next,-0x7ff5ec34,L"Map.prototype.forEach");
  }
  JavascriptError::ThrowTypeErrorVar
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec04,L"Map.prototype.forEach",L"Map");
}

Assistant:

Var JavascriptMap::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Map.prototype.forEach"));

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.forEach"), _u("Map"));
    }

    if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Map.prototype.forEach"));
    }
    RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);

    Var thisArg = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    auto iterator = map->GetIterator();

    while (iterator.Next())
    {
        Var key = iterator.Current().Key();
        Var value = iterator.Current().Value();

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg, value, key, map);
        }
        END_SAFE_REENTRANT_CALL
    }

    return scriptContext->GetLibrary()->GetUndefined();
}